

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall Lowerer::SplitBailForDebugger(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  BailOutKind BVar3;
  undefined4 *puVar4;
  BailOutInfo *bailOutInfo;
  BailOutInstrTemplate<IR::Instr> *instr_00;
  BailOutInstrTemplate<IR::Instr> *pBVar5;
  
  bVar2 = Func::IsJitInDebugMode(this->m_func);
  if ((!bVar2) || (instr->m_opcode == BailForDebugger)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3679,
                       "(m_func->IsJitInDebugMode() && instr->m_opcode != Js::OpCode::BailForDebugger)"
                       ,
                       "m_func->IsJitInDebugMode() && instr->m_opcode != Js::OpCode::BailForDebugger"
                      );
    if (!bVar2) goto LAB_0059766c;
    *puVar4 = 0;
  }
  bailOutInfo = IR::Instr::GetBailOutInfo(instr);
  BVar3 = IR::Instr::GetBailOutKind(instr);
  if ((BVar3 & BailOutForDebuggerBits) == BailOutInvalid) {
    if ((~instr->field_0x38 & 0x50) == 0 && instr->m_kind == InstrKindBranch) {
      return instr;
    }
    if (((instr->field_0x38 & 0x40) == 0) ||
       (BVar3 = IR::Instr::GetAuxBailOutKind(instr),
       (BVar3 & BailOutForDebuggerBits) == BailOutInvalid)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x36a7,"(0)","shouldn\'t get here");
      if (bVar2) {
        *puVar4 = 0;
        return instr;
      }
LAB_0059766c:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    BVar3 = IR::Instr::GetBailOutKind(instr);
    if ((BVar3 & BailOutForDebuggerBits) != BailOutInvalid) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x369b,"(!(instr->GetBailOutKind() & IR::BailOutForDebuggerBits))",
                         "There should be no debugger bits in main bailout kind.");
      if (!bVar2) goto LAB_0059766c;
      *puVar4 = 0;
    }
    BVar3 = IR::Instr::GetAuxBailOutKind(instr);
    pBVar5 = (BailOutInstrTemplate<IR::Instr> *)IR::Instr::ShareBailOut(instr);
    IR::Instr::ResetAuxBailOut(instr);
  }
  else {
    if ((instr->field_0x38 & 0x40) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3682,"(!instr->HasAuxBailOut())","!instr->HasAuxBailOut()");
      if (!bVar2) goto LAB_0059766c;
      *puVar4 = 0;
    }
    BVar3 = IR::Instr::GetBailOutKind(instr);
    if ((BVar3 & ~BailOutForDebuggerBits) != BailOutInvalid) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3683,"(!(instr->GetBailOutKind() & ~IR::BailOutForDebuggerBits))",
                         "There should only be debugger bailout bits in the instr.");
      if (!bVar2) goto LAB_0059766c;
      *puVar4 = 0;
    }
    BVar3 = IR::Instr::GetBailOutKind(instr);
    if (bailOutInfo->bailOutInstr == instr) {
      bailOutInfo->bailOutInstr = (Instr *)0x0;
    }
    IR::Instr::ClearBailOutInfo(instr);
    pBVar5 = (BailOutInstrTemplate<IR::Instr> *)0x0;
  }
  if ((BVar3 & BailOutForDebuggerBits) != BailOutInvalid) {
    instr_00 = IR::BailOutInstrTemplate<IR::Instr>::New
                         (BailForDebugger,BVar3 & BailOutForDebuggerBits,bailOutInfo,
                          bailOutInfo->bailOutFunc);
    IR::Instr::InsertAfter(instr,&instr_00->super_Instr);
    instr = &pBVar5->super_Instr;
    if (pBVar5 == (BailOutInstrTemplate<IR::Instr> *)0x0) {
      instr = &instr_00->super_Instr;
    }
  }
  return &((BailOutInstrTemplate<IR::Instr> *)instr)->super_Instr;
}

Assistant:

IR::Instr* Lowerer::SplitBailForDebugger(IR::Instr* instr)
{
    Assert(m_func->IsJitInDebugMode() && instr->m_opcode != Js::OpCode::BailForDebugger);

    IR::BailOutKind debuggerBailOutKind;    // Used for splitted instr.
    BailOutInfo* bailOutInfo = instr->GetBailOutInfo();
    IR::Instr* sharedBailoutInstr = nullptr;

    if (instr->GetBailOutKind() & IR::BailOutForDebuggerBits)
    {
        // debugger bailout is not shared.
        Assert(!instr->HasAuxBailOut());
        AssertMsg(!(instr->GetBailOutKind() & ~IR::BailOutForDebuggerBits), "There should only be debugger bailout bits in the instr.");

        debuggerBailOutKind = instr->GetBailOutKind() & IR::BailOutForDebuggerBits;

        // There is no non-debugger bailout in the instr, still can't clear bailout info, as we use it for the splitted instr,
        // but we need to mark the bailout as hasn't been generated yet.
        if (bailOutInfo->bailOutInstr == instr)
        {
            // null will be picked up by following BailOutInstr::New which will change it to new bailout instr.
            bailOutInfo->bailOutInstr = nullptr;
        }

        // Remove bailout info from the original instr which from now on becomes just regular instr, w/o deallocating bailout info.
        instr->ClearBailOutInfo();
    }
    else if (instr->IsBranchInstr() && instr->HasBailOutInfo() && instr->HasAuxBailOut())
    {
        // Branches with shared bailout are lowered in LowerCondBranchCheckBailOut,
        // can't do here because we need to use BranchBailOutRecord but don't know which BrTrue/BrFalse to use for it.
        debuggerBailOutKind = IR::BailOutInvalid;
    }
    else if (instr->HasAuxBailOut() && instr->GetAuxBailOutKind() & IR::BailOutForDebuggerBits)
    {
        // debugger bailout is shared.
        AssertMsg(!(instr->GetBailOutKind() & IR::BailOutForDebuggerBits), "There should be no debugger bits in main bailout kind.");

        debuggerBailOutKind = instr->GetAuxBailOutKind() & IR::BailOutForDebuggerBits;

        // This will insert SharedBail instr after current instr and set bailOutInfo->bailOutInstr to the shared one.
        sharedBailoutInstr = instr->ShareBailOut();

        // As we extracted aux bail out, invalidate all tracks of it in the instr.
        instr->ResetAuxBailOut();
    }
    else
    {
        AssertMsg(FALSE, "shouldn't get here");
        debuggerBailOutKind = IR::BailOutInvalid;
    }

    if (debuggerBailOutKind != IR::BailOutInvalid)
    {
        IR::BailOutInstr* debuggerBailoutInstr = IR::BailOutInstr::New(
            Js::OpCode::BailForDebugger, debuggerBailOutKind, bailOutInfo, bailOutInfo->bailOutFunc);
        instr->InsertAfter(debuggerBailoutInstr);

        // Since we go backwards, we need to process extracted out bailout for debugger first.
        instr = sharedBailoutInstr ? sharedBailoutInstr : debuggerBailoutInstr;
    }

    return instr;
}